

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_demon.cpp
# Opt level: O0

int AF_A_SargAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  int iVar1;
  AActor *pAVar2;
  AActor *target;
  bool bVar3;
  int local_94;
  bool local_6e;
  bool local_6b;
  TAngle<double> local_68;
  FName local_5c;
  int local_58;
  int local_54;
  int newdam;
  int damage;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_20;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_20 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_demon.cpp"
                  ,0x10,"int AF_A_SargAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_6b = true;
    if (stateowner != (AActor *)0x0) {
      local_6b = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_6b == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_demon.cpp"
                    ,0x10,"int AF_A_SargAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, pVStack_20[(int)self].field_0.field_1.atag != 1)) {
        bVar3 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_demon.cpp"
                      ,0x10,"int AF_A_SargAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      stateinfo = (FStateParamInfo *)pVStack_20[(int)self].field_0.field_1.a;
      local_6e = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_6e = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_6e == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_demon.cpp"
                      ,0x10,"int AF_A_SargAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar3 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar3 = true, pVStack_20[(int)self].field_0.field_1.atag != 8)) {
        bVar3 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar3) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_demon.cpp"
                      ,0x10,"int AF_A_SargAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
      }
      _newdam = pVStack_20[(int)self].field_0.field_1.a;
    }
    else {
      _newdam = (void *)0x0;
    }
    pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&stateowner->target);
    if (pAVar2 != (AActor *)0x0) {
      A_FaceTarget(stateowner);
      bVar3 = AActor::CheckMeleeRange(stateowner);
      if (bVar3) {
        iVar1 = FRandom::operator()(&pr_sargattack);
        local_54 = (iVar1 % 10 + 1) * 4;
        target = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&stateowner->target);
        pAVar2 = stateowner;
        iVar1 = local_54;
        FName::FName(&local_5c,NAME_Melee);
        TAngle<double>::TAngle(&local_68,0.0);
        local_58 = P_DamageMobj(target,pAVar2,pAVar2,iVar1,&local_5c,0,&local_68);
        local_94 = local_58;
        if (local_58 < 1) {
          local_94 = local_54;
        }
        pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&stateowner->target);
        P_TraceBleed(local_94,pAVar2,stateowner);
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_demon.cpp"
                ,0x10,"int AF_A_SargAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SargAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->target)
		return 0;
				
	A_FaceTarget (self);
	if (self->CheckMeleeRange ())
	{
		int damage = ((pr_sargattack()%10)+1)*4;
		int newdam = P_DamageMobj (self->target, self, self, damage, NAME_Melee);
		P_TraceBleed (newdam > 0 ? newdam : damage, self->target, self);
	}
	return 0;
}